

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtree.hpp
# Opt level: O2

ostream * __thiscall
perior::
rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
::dump_node(rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
            *this,ostream *os,size_t N,size_t depth,
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *clrs)

{
  stored_size_type sVar1;
  pointer bg;
  const_reference prVar2;
  reference puVar3;
  const_reference box;
  allocator local_92;
  allocator local_91;
  const_reference local_90;
  const_iterator i;
  const_iterator i_1;
  string local_50;
  
  local_90 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at(clrs,depth % 3);
  prVar2 = boost::container::
           vector<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>,_std::allocator<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>_>,_void>
           ::at(&this->tree_,N);
  std::__cxx11::string::string((string *)&i_1,"none",(allocator *)&local_50);
  to_svg<char,std::char_traits<char>,perior::point<double,2ul>>
            (os,&prVar2->box,&this->boundary_,local_90,1,(string *)&i_1);
  std::__cxx11::string::~string((string *)&i_1);
  std::operator<<(os,'\n');
  i.m_ptr = (unsigned_long *)&prVar2->entry;
  if (prVar2->is_leaf == true) {
    local_90 = (const_reference)
               ((long)&(((container_type *)i.m_ptr)->
                       super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
                       ).m_holder.super_static_storage_allocator<unsigned_long,_6UL,_0UL,_true>.
                       storage +
               (prVar2->entry).
               super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
               .m_holder.m_size * 8);
    while ((const_reference)i.m_ptr != local_90) {
      puVar3 = boost::container::vec_iterator<unsigned_long_*,_true>::operator*(&i);
      box = boost::container::
            vector<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_void>
            ::at(&this->container_,*puVar3);
      std::__cxx11::string::string((string *)&i_1,"black",&local_91);
      std::__cxx11::string::string((string *)&local_50,"black",&local_92);
      to_svg<char,std::char_traits<char>,perior::point<double,2ul>>
                (os,&box->first,&this->boundary_,(string *)&i_1,1,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&i_1);
      std::operator<<(os,'\n');
      boost::container::vec_iterator<unsigned_long_*,_true>::operator++(&i);
    }
  }
  else {
    sVar1 = (prVar2->entry).
            super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
            .m_holder.m_size;
    i_1.m_ptr = i.m_ptr;
    while (i_1.m_ptr !=
           (unsigned_long *)
           ((long)&(((container_type *)i.m_ptr)->
                   super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
                   ).m_holder.super_static_storage_allocator<unsigned_long,_6UL,_0UL,_true>.storage
           + sVar1 * 8)) {
      puVar3 = boost::container::vec_iterator<unsigned_long_*,_true>::operator*(&i_1);
      dump_node(this,os,*puVar3,depth + 1,clrs);
      boost::container::vec_iterator<unsigned_long_*,_true>::operator++(&i_1);
    }
  }
  return os;
}

Assistant:

std::ostream& dump_node(std::ostream& os,
              const std::size_t N, const std::size_t depth,
              const std::vector<std::string>& clrs) const
    {
        const std::string& clr = clrs.at(depth % 3);
        const node_type& node = tree_.at(N);
        to_svg(os, node.box, this->boundary_, clr, 1, "none");
        os << '\n';
        if(node.is_leaf)
        {
            for(typename node_type::const_iterator
                    i(node.entry.cbegin()), e(node.entry.cend()); i!=e; ++i)
            {
                to_svg(os, indexable_getter_(this->container_.at(*i)),
                       this->boundary_, "black", 1, "black");
                os << '\n';
            }
            return os;
        }
        else // internal node
        {
            for(typename node_type::const_iterator
                    i(node.entry.cbegin()), e(node.entry.cend()); i!=e; ++i)
            {
                this->dump_node(os, *i, depth+1, clrs);
            }
            return os;
        }
    }